

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O2

void __thiscall
rate_adaptive_code_from_decoder_obtain_from_advanced_encoder_equals_Test::TestBody
          (rate_adaptive_code_from_decoder_obtain_from_advanced_encoder_equals_Test *this)

{
  char *in_R9;
  AssertHelper AStack_188;
  Message local_180;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_178;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_160;
  vector<unsigned_short,_std::allocator<unsigned_short>_> rows_to_combine;
  string local_130;
  AssertionResult gtest_ar_;
  RateAdaptiveCode<unsigned_short> H1;
  RateAdaptiveCode<unsigned_short> H2;
  
  std::vector<unsigned_short,std::allocator<unsigned_short>>::vector<unsigned_short_const*,void>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&rows_to_combine,
             &AutogenRateAdapt::rows,
             (unsigned_short *)
             "N7testing8internal15TestFactoryImplI45encoder_rate_adapted_Hx_benchmark_unsafe_TestEE"
             ,(allocator_type *)&H1);
  LDPC4QKD::
  FixedSizeEncoderQC<unsigned_char,_64UL,_192UL,_32UL,_800UL,_unsigned_short,_unsigned_char,_unsigned_char>
  ::get_pos_varn(&local_160,
                 (FixedSizeEncoderQC<unsigned_char,_64UL,_192UL,_32UL,_800UL,_unsigned_short,_unsigned_char,_unsigned_char>
                  *)LDPC4QKD::encoder_2048x6144_4663d91);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_178,&rows_to_combine)
  ;
  LDPC4QKD::RateAdaptiveCode<unsigned_short>::RateAdaptiveCode
            (&H1,&local_160,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_178,0)
  ;
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_178);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_160);
  anon_unknown.dwarf_528ba::get_code_big_wra();
  gtest_ar_.success_ = LDPC4QKD::RateAdaptiveCode<unsigned_short>::operator==(&H1,&H2);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message(&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_130,(internal *)&gtest_ar_,(AssertionResult *)"H1 == H2","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&AStack_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/tests/test_rate_adaptive_code.cpp"
               ,0x161,local_130._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_188);
    std::__cxx11::string::~string((string *)&local_130);
    if (local_180.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_180.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  LDPC4QKD::RateAdaptiveCode<unsigned_short>::~RateAdaptiveCode(&H2);
  LDPC4QKD::RateAdaptiveCode<unsigned_short>::~RateAdaptiveCode(&H1);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&rows_to_combine.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  return;
}

Assistant:

TEST(rate_adaptive_code_from_decoder, obtain_from_advanced_encoder_equals) {
    std::vector<std::uint16_t> rows_to_combine(AutogenRateAdapt::rows.begin(), AutogenRateAdapt::rows.end());
    RateAdaptiveCode<std::uint16_t> H1(encoder_2048x6144_4663d91.get_pos_varn(), rows_to_combine);

    // TODO add random rate adaption for comparison
    auto H2 = get_code_big_wra();
    EXPECT_TRUE(H1 == H2);
}